

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp_mkdir.c
# Opt level: O3

int main(int argc,char **argv)

{
  in_addr_t iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  sockaddr_in sin;
  sockaddr local_28;
  
  iVar1 = 0x100007f;
  if (1 < argc) {
    iVar1 = inet_addr(argv[1]);
    if (argc != 2) {
      username = argv[2];
      if ((3 < (uint)argc) && (password = argv[3], argc != 4)) {
        sftppath = argv[4];
      }
    }
  }
  uVar2 = libssh2_init(0);
  if (uVar2 == 0) {
    iVar3 = socket(2,1,0);
    if (iVar3 == -1) {
      main_cold_4();
    }
    else {
      local_28.sa_family = 2;
      local_28.sa_data[0] = '\0';
      local_28.sa_data[1] = '\x16';
      local_28.sa_data._2_4_ = iVar1;
      iVar4 = connect(iVar3,&local_28,0x10);
      if (iVar4 == 0) {
        lVar5 = libssh2_session_init_ex(0,0,0,0);
        if (lVar5 == 0) {
          main_cold_3();
        }
        else {
          uVar2 = libssh2_session_handshake(lVar5,iVar3);
          if (uVar2 == 0) {
            main_cold_2();
          }
          else {
            fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar2);
          }
          libssh2_session_disconnect_ex(lVar5,0xb,"Normal Shutdown","");
          libssh2_session_free(lVar5);
        }
      }
      else {
        main_cold_1();
      }
      shutdown(iVar3,2);
      close(iVar3);
    }
    fwrite("all done\n",9,1,_stderr);
    libssh2_exit();
    iVar3 = 0;
  }
  else {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar2);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 1;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_SFTP *sftp_session;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        sftppath = argv[4];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /*
     * The application code is responsible for creating the socket
     * and establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    if(auth_pw) {
        /* We could authenticate via password */
        if(libssh2_userauth_password(session, username, password)) {
            fprintf(stderr, "Authentication by password failed.\n");
            goto shutdown;
        }
    }
    else {
        /* Or by public key */
        if(libssh2_userauth_publickey_fromfile(session, username,
                                               pubkey, privkey,
                                               password)) {
            fprintf(stderr, "Authentication by public key failed.\n");
            goto shutdown;
        }
    }

    sftp_session = libssh2_sftp_init(session);

    if(!sftp_session) {
        fprintf(stderr, "Unable to init SFTP session\n");
        goto shutdown;
    }

    /* Since we have not set non-blocking, tell libssh2 we are blocking */
    libssh2_session_set_blocking(session, 1);

    /* Make a directory via SFTP */
    rc = libssh2_sftp_mkdir(sftp_session, sftppath,
                            LIBSSH2_SFTP_S_IRWXU |
                            LIBSSH2_SFTP_S_IRGRP |
                            LIBSSH2_SFTP_S_IXGRP |
                            LIBSSH2_SFTP_S_IROTH |
                            LIBSSH2_SFTP_S_IXOTH);
    if(rc)
        fprintf(stderr, "libssh2_sftp_mkdir failed: %d\n", rc);

    libssh2_sftp_shutdown(sftp_session);

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return 0;
}